

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

bool __thiscall FTraceInfo::LineCheck(FTraceInfo *this,intercept_t *in,double dist,DVector3 *hit)

{
  ETraceResult EVar1;
  line_t_conflict *plVar2;
  extsector_t *peVar3;
  F3DFloor **ppFVar4;
  F3DFloor *pFVar5;
  secplane_t *psVar6;
  DVector2 *pos;
  bool bVar7;
  int side;
  ETraceStatus EVar8;
  sector_t_conflict *psVar9;
  sector_t_conflict *psVar10;
  FTraceResults *pFVar11;
  double *pdVar12;
  BYTE BVar13;
  int iVar14;
  uint uVar15;
  double *pdVar16;
  secplane_t *psVar17;
  double *pdVar18;
  FTextureID *pFVar19;
  uint *puVar20;
  F3DFloor *pFVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  long lStack_140;
  double local_128;
  double local_118;
  DVector2 local_e8;
  secplane_t *local_d8;
  double local_d0;
  DVector2 *local_c8;
  double local_c0;
  double local_b8;
  uint *local_a0;
  FTextureID *local_98;
  double *local_90;
  double *local_88;
  double *local_80;
  uint *local_78;
  FTextureID *local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  secplane_t *local_50;
  DVector2 local_48;
  
  plVar2 = (in->d).line;
  psVar9 = plVar2->frontsector;
  psVar10 = this->CurSector;
  side = 0;
  local_c0 = dist;
  if (psVar9->sectornum != psVar10->sectornum) {
    if (plVar2->backsector == (sector_t_conflict *)0x0) {
      side = 0;
    }
    else {
      if (plVar2->backsector->sectornum == psVar10->sectornum) {
        side = 1;
        goto LAB_0045adbe;
      }
      local_e8.X = (this->Start).X;
      local_e8.Y = (this->Start).Y;
      side = P_PointOnLineSide(&local_e8,plVar2);
      psVar9 = (sector_t_conflict *)(&((in->d).thing)->SpriteAngle)[side != 0].Degrees;
    }
    this->CurSector = psVar9;
    psVar10 = psVar9;
  }
LAB_0045adbe:
  plVar2 = (in->d).line;
  if ((plVar2->flags & 4) == 0) {
    psVar9 = (sector_t_conflict *)0x0;
  }
  else {
    psVar9 = (sector_t_conflict *)plVar2->bbox[(ulong)(side == 0) + 4];
    if (((i_compatflags._1_1_ & 0x20) != 0) && (plVar2->backsector == plVar2->frontsector)) {
      uVar15 = this->TraceFlags;
      if ((uVar15 & 2) != 0) {
        P_ActivateLine(plVar2,this->IgnoreThis,side,0x20,(DVector3 *)0x0);
        uVar15 = this->TraceFlags;
      }
      if ((uVar15 & 4) != 0) {
        P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
        return true;
      }
      return true;
    }
  }
  local_e8.X = hit->X;
  local_e8.Y = hit->Y;
  local_d0 = secplane_t::ZatPoint(&psVar10->floorplane,&local_e8);
  local_e8.X = hit->X;
  local_e8.Y = hit->Y;
  dVar22 = secplane_t::ZatPoint(&this->CurSector->ceilingplane,&local_e8);
  if (psVar9 == (sector_t_conflict *)0x0) {
    local_128 = 0.0;
    local_118 = 0.0;
  }
  else {
    local_e8.X = hit->X;
    local_e8.Y = hit->Y;
    local_118 = secplane_t::ZatPoint(&psVar9->floorplane,&local_e8);
    local_e8.X = hit->X;
    local_e8.Y = hit->Y;
    local_128 = secplane_t::ZatPoint(&psVar9->ceilingplane,&local_e8);
  }
  psVar10 = sector_t::GetHeightSec(this->CurSector);
  if ((psVar10 != (sector_t_conflict *)0x0) && (this->Results->CrossedWater == (sector_t *)0x0)) {
    dVar25 = (this->Start).Z;
    psVar17 = &psVar10->floorplane;
    local_e8.X = (this->Start).X;
    local_e8.Y = (this->Start).Y;
    dVar23 = secplane_t::ZatPoint(psVar17,&local_e8);
    if (dVar23 < dVar25) {
      dVar25 = hit->Z;
      local_48.X = hit->X;
      local_48.Y = hit->Y;
      dVar23 = secplane_t::ZatPoint(psVar17,&local_48);
      if ((dVar25 <= dVar23) && (bVar7 = CheckPlane(this,psVar17), bVar7)) {
        pFVar11 = this->Results;
        pFVar11->CrossedWater = (sector_t *)(sectors + this->CurSector->sectornum);
        (pFVar11->CrossedWaterPos).Z = (pFVar11->HitPos).Z;
        dVar25 = (pFVar11->HitPos).Y;
        (pFVar11->CrossedWaterPos).X = (pFVar11->HitPos).X;
        (pFVar11->CrossedWaterPos).Y = dVar25;
        pFVar11->Distance = 0.0;
      }
    }
  }
  dVar25 = hit->Z;
  if (dVar25 <= local_d0) {
    pFVar11 = this->Results;
    pFVar11->HitType = TRACE_HitFloor;
    iVar14 = this->CurSector->planes[0].Texture.texnum;
LAB_0045b00c:
    (pFVar11->HitTexture).texnum = iVar14;
  }
  else {
    if (dVar22 <= dVar25) {
      pFVar11 = this->Results;
      pFVar11->HitType = TRACE_HitCeiling;
      iVar14 = this->CurSector->planes[1].Texture.texnum;
      goto LAB_0045b00c;
    }
    if (((psVar9 == (sector_t_conflict *)0x0) || (dVar25 < local_118)) || (local_128 < dVar25)) {
      pFVar11 = this->Results;
      pFVar11->HitType = TRACE_HitWall;
      if (psVar9 != (sector_t_conflict *)0x0) goto LAB_0045b0c0;
      BVar13 = '\0';
LAB_0045b655:
      pFVar11->Tier = BVar13;
      if ((this->TraceFlags & 4) != 0) {
LAB_0045b665:
        P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
      }
    }
    else {
      if ((((in->d).line)->flags & this->WallMask) != 0) {
        pFVar11 = this->Results;
        pFVar11->HitType = TRACE_HitWall;
LAB_0045b0c0:
        BVar13 = '\x02';
        if (local_118 < dVar25) {
          BVar13 = local_128 <= dVar25;
        }
        goto LAB_0045b655;
      }
      if ((psVar9->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
        memcpy(this->DummySector + this->sectorsel,psVar9,0x218);
        uVar15 = this->sectorsel;
        psVar9 = this->DummySector + (int)uVar15;
        this->sectorsel = uVar15 ^ 1;
        peVar3 = this->DummySector[(int)uVar15].e;
        ppFVar4 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
        local_50 = &this->DummySector[(int)uVar15].ceilingplane;
        local_c8 = &this->DummySector[(int)uVar15].centerspot;
        local_80 = &this->DummySector[(int)uVar15].ceilingplane.normal.Z;
        local_88 = &this->DummySector[(int)uVar15].ceilingplane.normal.Y;
        local_90 = &this->DummySector[(int)uVar15].ceilingplane.D;
        local_98 = &this->DummySector[(int)uVar15].planes[1].Texture;
        local_a0 = this->DummySector[(int)uVar15].Portals + 1;
        local_d8 = &this->DummySector[(int)uVar15].floorplane;
        local_58 = &this->DummySector[(int)uVar15].floorplane.normal.Z;
        local_60 = &this->DummySector[(int)uVar15].floorplane.normal.Y;
        local_68 = &this->DummySector[(int)uVar15].floorplane.D;
        local_70 = &this->DummySector[(int)uVar15].planes[0].Texture;
        local_78 = this->DummySector[(int)uVar15].Portals;
        local_d0 = (double)((ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                   Count << 3);
        for (dVar22 = 0.0; local_d0 != dVar22; dVar22 = (double)((long)dVar22 + 8)) {
          pFVar5 = *(F3DFloor **)((long)ppFVar4 + (long)dVar22);
          dVar25 = local_118;
          if (((pFVar5->flags & 1) != 0) && ((pFVar5->flags >> 0x1a & 1) != this->inshootthrough)) {
            local_e8.X = hit->X;
            local_e8.Y = hit->Y;
            dVar23 = secplane_t::ZatPoint((pFVar5->bottom).plane,&local_e8);
            local_e8.X = hit->X;
            local_e8.Y = hit->Y;
            dVar24 = secplane_t::ZatPoint((pFVar5->top).plane,&local_e8);
            psVar17 = local_50;
            pos = local_c8;
            if (hit->Z <= dVar24) {
              if (dVar23 <= hit->Z) {
                pFVar11 = this->Results;
                pFVar11->HitType = TRACE_HitWall;
                pFVar11->Tier = '\x03';
                pFVar11->ffloor = pFVar5;
                if (((this->TraceFlags & 4) != 0) && (((in->d).line)->special != 0)) {
                  P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
                }
                goto LAB_0045b00f;
              }
              if (ABS(local_128 - dVar23) < 1.52587890625e-05) {
                local_b8 = secplane_t::ZatPoint(local_50,local_c8);
                dVar24 = secplane_t::ZatPoint((pFVar5->bottom).plane,pos);
                local_128 = (double)(~-(ulong)(dVar24 < local_b8) & (ulong)local_128 |
                                    (ulong)(dVar23 + 1.52587890625e-05) &
                                    -(ulong)(dVar24 < local_b8));
              }
              lStack_140 = 8;
              pdVar12 = local_80;
              pdVar16 = local_88;
              pdVar18 = local_90;
              pFVar19 = local_98;
              puVar20 = local_a0;
              pFVar21 = pFVar5;
              if (dVar23 < local_128) goto LAB_0045b5aa;
            }
            else {
              psVar17 = local_d8;
              if (ABS(local_118 - dVar24) < 1.52587890625e-05) {
                local_b8 = secplane_t::ZatPoint(local_d8,local_c8);
                psVar17 = local_d8;
                dVar25 = secplane_t::ZatPoint((pFVar5->top).plane,pos);
                dVar25 = (double)(~-(ulong)(local_b8 < dVar25) & (ulong)local_118 |
                                 (ulong)(dVar24 + -1.52587890625e-05) & -(ulong)(local_b8 < dVar25))
                ;
              }
              lStack_140 = 0x30;
              pdVar12 = local_58;
              pdVar16 = local_60;
              pdVar18 = local_68;
              pFVar19 = local_70;
              puVar20 = local_78;
              pFVar21 = (F3DFloor *)&pFVar5->top;
              local_118 = dVar24;
              dVar23 = local_128;
              if (dVar25 < dVar24) {
LAB_0045b5aa:
                local_128 = dVar23;
                psVar6 = (pFVar21->bottom).plane;
                *pdVar12 = (psVar6->normal).Z;
                *pdVar16 = (psVar6->normal).Y;
                (psVar17->normal).X = (psVar6->normal).X;
                dVar25 = psVar6->negiC;
                *pdVar18 = psVar6->D;
                pdVar18[1] = dVar25;
                pFVar19->texnum = **(int **)((long)&(pFVar5->bottom).plane + lStack_140);
                *puVar20 = 0;
                dVar25 = local_118;
              }
            }
          }
          local_118 = dVar25;
        }
      }
      this->Results->HitType = TRACE_HitNone;
      uVar15 = this->TraceFlags;
      if ((uVar15 & 2) != 0) {
        P_ActivateLine((in->d).line,this->IgnoreThis,side,0x20,(DVector3 *)0x0);
        uVar15 = this->TraceFlags;
      }
      if ((uVar15 & 4) != 0) goto LAB_0045b665;
    }
  }
LAB_0045b00f:
  pFVar11 = this->Results;
  EVar1 = pFVar11->HitType;
  if (EVar1 == TRACE_HitNone) goto LAB_0045b1cd;
  psVar10 = this->CurSector;
  pFVar11->Sector = (sector_t *)(sectors + psVar10->sectornum);
  if (EVar1 != TRACE_HitWall) {
    psVar17 = &psVar10->floorplane;
    if (EVar1 != TRACE_HitFloor) {
      psVar17 = &psVar10->ceilingplane;
    }
    bVar7 = CheckPlane(this,psVar17);
    if (!bVar7) {
      if (psVar9 == (sector_t_conflict *)0x0) {
        pFVar11 = this->Results;
        pFVar11->HitType = TRACE_HitWall;
        BVar13 = '\0';
      }
      else {
        dVar22 = hit->Z;
        pFVar11 = this->Results;
        if ((local_118 < dVar22) && (dVar22 < local_128)) {
          pFVar11->HitType = TRACE_HitNone;
          goto LAB_0045b17d;
        }
        pFVar11->HitType = TRACE_HitWall;
        BVar13 = '\x02';
        if (local_118 < dVar22) {
          BVar13 = local_128 <= dVar22;
        }
      }
      pFVar11->Tier = BVar13;
      if ((this->TraceFlags & 4) != 0) {
        P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
      }
    }
  }
LAB_0045b17d:
  pFVar11 = this->Results;
  if (pFVar11->HitType == TRACE_HitWall) {
    (pFVar11->HitPos).Z = hit->Z;
    dVar22 = hit->Y;
    (pFVar11->HitPos).X = hit->X;
    (pFVar11->HitPos).Y = dVar22;
    SetSourcePosition(this);
    pFVar11 = this->Results;
    pFVar11->Distance = local_c0;
    pFVar11->Fraction = in->frac;
    pFVar11->Line = (line_t *)in->d;
    pFVar11->Side = (BYTE)side;
  }
LAB_0045b1cd:
  if ((this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) &&
     (pFVar11->HitType != TRACE_HitNone)) {
    EVar8 = (*this->TraceCallback)(pFVar11,this->TraceCallbackData);
    if (EVar8 == TRACE_Stop) {
      return false;
    }
    if (EVar8 == TRACE_Skip) {
      pFVar11 = this->Results;
      pFVar11->HitType = TRACE_HitNone;
    }
    else {
      if (EVar8 == TRACE_Abort) {
        this->Results->HitType = TRACE_HitNone;
        return false;
      }
      pFVar11 = this->Results;
    }
  }
  if (pFVar11->HitType != TRACE_HitNone) {
    return false;
  }
  this->CurSector = psVar9;
  this->EnterDist = local_c0;
  return true;
}

Assistant:

bool FTraceInfo::LineCheck(intercept_t *in, double dist, DVector3 hit)
{
	int lineside;
	sector_t *entersector;

	double ff, fc, bf = 0, bc = 0;

	if (in->d.line->frontsector->sectornum == CurSector->sectornum)
	{
		lineside = 0;
	}
	else if (in->d.line->backsector && in->d.line->backsector->sectornum == CurSector->sectornum)
	{
		lineside = 1;
	}
	else
	{ // Dammit. Why does Doom have to allow non-closed sectors?
		if (in->d.line->backsector == NULL)
		{
			lineside = 0;
			CurSector = in->d.line->frontsector;
		}
		else
		{
			lineside = P_PointOnLineSide(Start, in->d.line);
			CurSector = lineside ? in->d.line->backsector : in->d.line->frontsector;
		}
	}

	if (!(in->d.line->flags & ML_TWOSIDED))
	{
		entersector = NULL;
	}
	else
	{
		entersector = (lineside == 0) ? in->d.line->backsector : in->d.line->frontsector;

		// For backwards compatibility: Ignore lines with the same sector on both sides.
		// This is the way Doom.exe did it and some WADs (e.g. Alien Vendetta MAP15) need it.
		if (i_compatflags & COMPATF_TRACE && in->d.line->backsector == in->d.line->frontsector)
		{
			// We must check special activation here because the code below is never reached.
			if (TraceFlags & TRACE_PCross)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_PCross);
			}
			if (TraceFlags & TRACE_Impact)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
			}
			return true;
		}
	}

	ff = CurSector->floorplane.ZatPoint(hit);
	fc = CurSector->ceilingplane.ZatPoint(hit);

	if (entersector != NULL)
	{
		bf = entersector->floorplane.ZatPoint(hit);
		bc = entersector->ceilingplane.ZatPoint(hit);
	}

	sector_t *hsec = CurSector->GetHeightSec();
	if (Results->CrossedWater == NULL &&
		hsec != NULL &&
		Start.Z > hsec->floorplane.ZatPoint(Start) &&
		hit.Z <= hsec->floorplane.ZatPoint(hit))
	{
		// hit crossed a water plane
		if (CheckSectorPlane(hsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
	}

	if (hit.Z <= ff)
	{
		// hit floor in front of wall
		Results->HitType = TRACE_HitFloor;
		Results->HitTexture = CurSector->GetTexture(sector_t::floor);
	}
	else if (hit.Z >= fc)
	{
		// hit ceiling in front of wall
		Results->HitType = TRACE_HitCeiling;
		Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
	}
	else if (entersector == NULL ||
		hit.Z < bf || hit.Z > bc ||
		in->d.line->flags & WallMask)
	{
		// hit the wall
		Results->HitType = TRACE_HitWall;
		Results->Tier =
			entersector == NULL ? TIER_Middle :
			hit.Z <= bf ? TIER_Lower :
			hit.Z >= bc ? TIER_Upper : TIER_Middle;
		if (TraceFlags & TRACE_Impact)
		{
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
		}
	}
	else
	{ 	// made it past the wall
		// check for 3D floors first
		if (entersector->e->XFloor.ffloors.Size())
		{
			memcpy(&DummySector[sectorsel], entersector, sizeof(sector_t));
			entersector = &DummySector[sectorsel];
			sectorsel ^= 1;

			for (auto rover : entersector->e->XFloor.ffloors)
			{
				int entershootthrough = !!(rover->flags&FF_SHOOTTHROUGH);

				if (entershootthrough != inshootthrough && rover->flags&FF_EXISTS)
				{
					double ff_bottom = rover->bottom.plane->ZatPoint(hit);
					double ff_top = rover->top.plane->ZatPoint(hit);

					// clip to the part of the sector we are in
					if (hit.Z > ff_top)
					{
						// 3D floor height is the same as the floor height. We need to test a second spot to see if it is above or below
						if (fabs(bf - ff_top) < EQUAL_EPSILON)
						{
							double cf = entersector->floorplane.ZatPoint(entersector->centerspot);
							double ffc = rover->top.plane->ZatPoint(entersector->centerspot);
							if (ffc > cf)
							{
								bf = ff_top - EQUAL_EPSILON;
							}
						}
						
						// above
						if (bf < ff_top)
						{
							entersector->floorplane = *rover->top.plane;
							entersector->SetTexture(sector_t::floor, *rover->top.texture, false);
							entersector->ClearPortal(sector_t::floor);
							bf = ff_top;
						}
					}
					else if (hit.Z < ff_bottom)
					{
						// 3D floor height is the same as the ceiling height. We need to test a second spot to see if it is above or below
						if (fabs(bc - ff_bottom) < EQUAL_EPSILON)
						{
							double cc = entersector->ceilingplane.ZatPoint(entersector->centerspot);
							double fcc = rover->bottom.plane->ZatPoint(entersector->centerspot);
							if (fcc < cc)
							{
								bc = ff_bottom + EQUAL_EPSILON;
							}
						}

						//below
						if (bc > ff_bottom)
						{
							entersector->ceilingplane = *rover->bottom.plane;
							entersector->SetTexture(sector_t::ceiling, *rover->bottom.texture, false);
							entersector->ClearPortal(sector_t::ceiling);
							bc = ff_bottom;
						}
					}
					else
					{
						//hit the edge - equivalent to hitting the wall
						Results->HitType = TRACE_HitWall;
						Results->Tier = TIER_FFloor;
						Results->ffloor = rover;
						if ((TraceFlags & TRACE_Impact) && in->d.line->special)
						{
							P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
						}
						goto cont;
					}
				}
			}
		}

		Results->HitType = TRACE_HitNone;
		if (TraceFlags & TRACE_PCross)
		{
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_PCross);
		}
		if (TraceFlags & TRACE_Impact)
		{ // This is incorrect for "impact", but Hexen did this, so
		  // we need to as well, for compatibility
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
		}
	}
cont:

	if (Results->HitType != TRACE_HitNone)
	{
		// We hit something, so figure out where exactly
		Results->Sector = &sectors[CurSector->sectornum];

		if (Results->HitType != TRACE_HitWall &&
			!CheckSectorPlane(CurSector, Results->HitType == TRACE_HitFloor))
		{ // trace is parallel to the plane (or right on it)
			if (entersector == NULL)
			{
				Results->HitType = TRACE_HitWall;
				Results->Tier = TIER_Middle;
			}
			else
			{
				if (hit.Z <= bf || hit.Z >= bc)
				{
					Results->HitType = TRACE_HitWall;
					Results->Tier =
						hit.Z <= bf ? TIER_Lower :
						hit.Z >= bc ? TIER_Upper : TIER_Middle;
				}
				else
				{
					Results->HitType = TRACE_HitNone;
				}
			}
			if (Results->HitType == TRACE_HitWall && TraceFlags & TRACE_Impact)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
			}
		}

		if (Results->HitType == TRACE_HitWall)
		{
			Results->HitPos = hit;
			SetSourcePosition();
			Results->Distance = dist;
			Results->Fraction = in->frac;
			Results->Line = in->d.line;
			Results->Side = lineside;
		}
	}

	if (TraceCallback != NULL && Results->HitType != TRACE_HitNone)
	{
		switch (TraceCallback(*Results, TraceCallbackData))
		{
		case TRACE_Stop:	return false;
		case TRACE_Abort:	Results->HitType = TRACE_HitNone; return false;
		case TRACE_Skip:	Results->HitType = TRACE_HitNone; break;
		default:			break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		CurSector = entersector;
		EnterDist = dist;
		return true;
	}
	else
	{
		return false;
	}
}